

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O1

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:942:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:942:17)>
             *this)

{
  MutexGuarded<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_> *this_00;
  Disposer *pDVar1;
  PromiseFulfiller<void> *pPVar2;
  ReducePromises<void> node;
  Disposer *pDVar3;
  CrossThreadPromiseFulfiller<void> *pCVar4;
  Executor *this_01;
  PromiseCrossThreadFulfillerPair<void> paf;
  WaitScope waitScope;
  NullableValue<kj::Exception> _e950;
  DebugExpression<bool> _kjCondition;
  EventLoop loop;
  UnixEventPort port;
  PromiseCrossThreadFulfillerPair<void> local_538;
  char *local_520;
  char *pcStack_518;
  undefined8 local_510;
  EventLoop *local_508;
  undefined4 local_500;
  long local_4f8;
  undefined8 uStack_4f0;
  char local_4c8;
  Exception local_4c0;
  undefined1 local_328;
  EventLoop local_190;
  UnixEventPort local_118;
  
  UnixEventPort::UnixEventPort(&local_118);
  EventLoop::EventLoop(&local_190,&local_118.super_EventPort);
  local_500 = 0xffffffff;
  local_4f8 = 0;
  uStack_4f0 = 0;
  local_508 = &local_190;
  EventLoop::enterScope(&local_190);
  this_01 = getCurrentThreadExecutor();
  Executor::newPromiseAndCrossThreadFulfiller<void>(&local_538,this_01);
  pCVar4 = local_538.fulfiller.ptr;
  pDVar3 = local_538.fulfiller.disposer;
  local_538.fulfiller.ptr = (CrossThreadPromiseFulfiller<void> *)0x0;
  this_00 = (this->f).fulfillerMutex;
  local_4c8 = 0;
  kj::_::Mutex::lock(&this_00->mutex,0);
  pDVar1 = (this_00->value).ptr.disposer;
  pPVar2 = (this_00->value).ptr.ptr;
  (this_00->value).ptr.disposer = pDVar3;
  (this_00->value).ptr.ptr = &pCVar4->super_PromiseFulfiller<void>;
  if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
    (**pDVar1->_vptr_Disposer)();
  }
  kj::_::Mutex::unlock(&this_00->mutex,EXCLUSIVE,(Waiter *)0x0);
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
  ;
  pcStack_518 = "operator()";
  local_510 = 0x24000003b6;
  Promise<void>::wait(&local_538.promise,&local_508);
  local_328 = 0;
  local_4c8 = '\0';
  if (kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
               ,0x3b6,ERROR,"\"code did not throw: \" \"paf.promise.wait(waitScope)\"",
               (char (*) [48])"code did not throw: paf.promise.wait(waitScope)");
  }
  if (local_4c8 == '\x01') {
    Exception::~Exception(&local_4c0);
  }
  pCVar4 = local_538.fulfiller.ptr;
  if (local_538.fulfiller.ptr != (CrossThreadPromiseFulfiller<void> *)0x0) {
    local_538.fulfiller.ptr = (CrossThreadPromiseFulfiller<void> *)0x0;
    (**(local_538.fulfiller.disposer)->_vptr_Disposer)
              (local_538.fulfiller.disposer,
               (pCVar4->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector
               [-2] + (long)&(pCVar4->super_PromiseFulfiller<void>).super_PromiseRejector.
                             _vptr_PromiseRejector);
  }
  node.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_538.promise;
  if (local_538.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    local_538.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.super_PromiseBase.node.ptr);
  }
  if (local_4f8 == 0) {
    EventLoop::leaveScope(local_508);
  }
  EventLoop::~EventLoop(&local_190);
  UnixEventPort::~UnixEventPort(&local_118);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }